

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode
SUNAdaptController_SetParams_Soderlind
          (SUNAdaptController C,sunrealtype k1,sunrealtype k2,sunrealtype k3,sunrealtype k4,
          sunrealtype k5)

{
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype k5_local;
  sunrealtype k4_local;
  sunrealtype k3_local;
  sunrealtype k2_local;
  sunrealtype k1_local;
  SUNAdaptController C_local;
  
  *(sunrealtype *)C->content = k1;
  *(sunrealtype *)((long)C->content + 8) = k2;
  *(sunrealtype *)((long)C->content + 0x10) = k3;
  *(sunrealtype *)((long)C->content + 0x18) = k4;
  *(sunrealtype *)((long)C->content + 0x20) = k5;
  if ((((k5 != 0.0) || (NAN(k5))) || (k3 != 0.0)) || (NAN(k3))) {
    *(undefined4 *)((long)C->content + 0x54) = 2;
  }
  else if (((k4 != 0.0) || (NAN(k4))) || ((k2 != 0.0 || (NAN(k2))))) {
    *(undefined4 *)((long)C->content + 0x54) = 1;
  }
  else {
    *(undefined4 *)((long)C->content + 0x54) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_Soderlind(SUNAdaptController C,
                                                  sunrealtype k1,
                                                  sunrealtype k2, sunrealtype k3,
                                                  sunrealtype k4, sunrealtype k5)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1;
  SODERLIND_K2(C) = k2;
  SODERLIND_K3(C) = k3;
  SODERLIND_K4(C) = k4;
  SODERLIND_K5(C) = k5;

  if (k5 != SUN_RCONST(0.0) || k3 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 2;
  }
  else if (k4 != SUN_RCONST(0.0) || k2 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 1;
  }
  else { SODERLIND_HISTORYSIZE(C) = 0; }
  return SUN_SUCCESS;
}